

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

size_t roaring_bitmap_size_in_bytes(roaring_bitmap_t *r)

{
  roaring_bitmap_t *r_00;
  uint64_t uVar1;
  uint64_t sizeasarray;
  size_t portablesize;
  undefined1 *local_20;
  
  r_00 = (roaring_bitmap_t *)roaring_bitmap_portable_size_in_bytes((roaring_bitmap_t *)0x114773);
  uVar1 = roaring_bitmap_get_cardinality(r_00);
  if (r_00 < (roaring_bitmap_t *)(uVar1 * 4 + 4)) {
    local_20 = (undefined1 *)((long)&(r_00->high_low_container).size + 1);
  }
  else {
    local_20 = (undefined1 *)(uVar1 * 4 + 5);
  }
  return (size_t)local_20;
}

Assistant:

size_t roaring_bitmap_size_in_bytes(const roaring_bitmap_t *r) {
    size_t portablesize = roaring_bitmap_portable_size_in_bytes(r);
    uint64_t sizeasarray =
        roaring_bitmap_get_cardinality(r) * sizeof(uint32_t) + sizeof(uint32_t);
    return portablesize < sizeasarray ? portablesize + 1
                                      : (size_t)sizeasarray + 1;
}